

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall
SimpleLoggerMgr::_flushStackTraceBuffer
          (SimpleLoggerMgr *this,size_t buffer_len,uint32_t tid_hash,uint64_t kernel_tid,
          bool crash_origin)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ulong uVar3;
  char cVar4;
  char cVar5;
  long *plVar6;
  ostream *poVar7;
  uint64_t uVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  string msg;
  string __str;
  char temp_buf [256];
  string local_1b8;
  char *local_198;
  ulong local_190;
  char local_188 [16];
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  char *local_158;
  uint local_150;
  char local_148 [16];
  char local_138 [264];
  
  local_198 = local_188;
  local_190 = 0;
  local_188[0] = '\0';
  snprintf(local_138,0x100,"\nThread %04x",tid_hash);
  std::__cxx11::string::append((char *)&local_198);
  if (kernel_tid != 0) {
    cVar5 = '\x01';
    if (9 < kernel_tid) {
      uVar8 = kernel_tid;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar8 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00180991;
        }
        if (uVar8 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00180991;
        }
        if (uVar8 < 10000) goto LAB_00180991;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_00180991:
    local_158 = local_148;
    std::__cxx11::string::_M_construct((ulong)&local_158,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_158,local_150,kernel_tid);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x46f852);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_168 = *plVar9;
      lStack_160 = plVar6[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *plVar9;
      local_178 = (long *)*plVar6;
    }
    local_170 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar10;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178);
    }
    if (local_158 != local_148) {
      operator_delete(local_158);
    }
  }
  if (crash_origin) {
    std::__cxx11::string::append((char *)&local_198);
  }
  std::__cxx11::string::append((char *)&local_198);
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,this->stackTraceBuffer,this->stackTraceBuffer + buffer_len);
  std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  uVar3 = local_190;
  if (local_190 != 0) {
    uVar11 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_198);
      flushAllLoggers(this,2,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      uVar11 = uVar11 + 0xc00;
    } while (uVar11 < uVar3);
  }
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->crashDumpFile,local_198,local_190);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::_flushStackTraceBuffer(size_t buffer_len,
                                             uint32_t tid_hash,
                                             uint64_t kernel_tid,
                                             bool crash_origin)
{
    std::string msg;
    char temp_buf[256];
    snprintf(temp_buf, 256, "\nThread %04x", tid_hash);
    msg += temp_buf;
    if (kernel_tid) {
        msg += " (" + std::to_string(kernel_tid) + ")";
    }
    if (crash_origin) {
        msg += " (crashed here)";
    }
    msg += "\n\n";
    msg += std::string(stackTraceBuffer, buffer_len);

    size_t msg_len = msg.size();
    size_t per_log_size = SimpleLogger::MSG_SIZE - 1024;
    for (size_t ii=0; ii<msg_len; ii+=per_log_size) {
        flushAllLoggers(2, msg.substr(ii, per_log_size));
    }

    if (crashDumpFile.is_open()) {
        crashDumpFile << msg << std::endl;
    }
}